

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  ushort uVar1;
  stbi_uc *psVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  ushort uVar11;
  uint uVar12;
  byte *pbVar13;
  uint uVar14;
  stbi_uc sVar15;
  stbi_uc *psVar16;
  ulong uVar17;
  byte *pbVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_001416ad:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    iVar5 = 0;
    do {
      if (iVar5 < 1) {
        uVar14 = a->code_buffer;
        pbVar13 = a->zbuffer;
        iVar20 = iVar5;
        do {
          uVar12 = 0;
          pbVar18 = pbVar13;
          if (pbVar13 < a->zbuffer_end) {
            pbVar18 = pbVar13 + 1;
            a->zbuffer = pbVar18;
            uVar12 = (uint)*pbVar13;
          }
          uVar14 = uVar14 | uVar12 << ((byte)iVar20 & 0x1f);
          a->code_buffer = uVar14;
          iVar5 = iVar20 + 8;
          a->num_bits = iVar5;
          bVar3 = iVar20 < 0x11;
          pbVar13 = pbVar18;
          iVar20 = iVar5;
        } while (bVar3);
      }
      else {
        uVar14 = a->code_buffer;
      }
      uVar22 = uVar14 >> 1;
      a->code_buffer = uVar22;
      uVar12 = iVar5 - 1;
      a->num_bits = uVar12;
      if (uVar12 < 2) {
        pbVar13 = a->zbuffer;
        iVar5 = iVar5 + -9;
        do {
          iVar20 = iVar5;
          uVar12 = 0;
          pbVar18 = pbVar13;
          if (pbVar13 < a->zbuffer_end) {
            pbVar18 = pbVar13 + 1;
            a->zbuffer = pbVar18;
            uVar12 = (uint)*pbVar13;
          }
          iVar5 = iVar20 + 8;
          uVar22 = uVar22 | uVar12 << ((byte)iVar5 & 0x1f);
          a->code_buffer = uVar22;
          a->num_bits = iVar20 + 0x10;
          pbVar13 = pbVar18;
        } while (iVar5 < 0x11);
        uVar12 = iVar20 + 0x10;
      }
      uVar23 = uVar22 >> 2;
      a->code_buffer = uVar23;
      uVar6 = uVar12 - 2;
      a->num_bits = uVar6;
      switch(uVar22 & 3) {
      case 0:
        if ((uVar6 & 7) != 0) {
          uVar23 = uVar23 >> (sbyte)(uVar6 & 7);
          a->code_buffer = uVar23;
          uVar6 = uVar6 & 0xfffffff8;
          a->num_bits = uVar6;
        }
        if ((int)uVar6 < 1) {
          uVar17 = 0;
LAB_001420a3:
          psVar16 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar16 < psVar2) {
              a->zbuffer = psVar16 + 1;
              sVar15 = *psVar16;
              psVar16 = psVar16 + 1;
            }
            else {
              sVar15 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar17) = sVar15;
            uVar17 = uVar17 + 1;
          } while (uVar17 != 4);
        }
        else {
          uVar12 = uVar6 - 1 >> 3;
          uVar17 = (ulong)(uVar12 + 1);
          uVar19 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar19 + 1) = (char)uVar23;
            uVar23 = uVar23 >> 8;
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
          a->code_buffer = uVar23;
          a->num_bits = (uVar6 - (uVar6 - 1 & 0xfffffff8)) + -8;
          if (uVar19 < 3) goto LAB_001420a3;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          psVar16 = a->zbuffer;
          uVar17 = (ulong)local_814.fast[0];
          if (psVar16 + uVar17 <= a->zbuffer_end) {
            if (a->zout_end < obuf + uVar17) {
              iVar5 = stbi__zexpand(a,obuf,(uint)local_814.fast[0]);
              if (iVar5 == 0) {
                return 0;
              }
              psVar16 = a->zbuffer;
              obuf = a->zout;
            }
            memcpy(obuf,psVar16,uVar17);
            a->zbuffer = a->zbuffer + uVar17;
            obuf = a->zout + uVar17;
            a->zout = obuf;
            goto LAB_0014214e;
          }
          pcVar8 = "read past buffer";
        }
        else {
          pcVar8 = "zlib corrupt";
        }
        goto LAB_00142187;
      case 1:
        iVar5 = stbi__zbuild_huffman
                          (z,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar5 == 0) {
          return 0;
        }
        psVar16 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar20 = 0x20;
        break;
      case 2:
        if (uVar6 < 5) {
          pbVar13 = a->zbuffer;
          iVar5 = uVar12 - 10;
          do {
            iVar20 = iVar5;
            uVar12 = 0;
            pbVar18 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar18 = pbVar13 + 1;
              a->zbuffer = pbVar18;
              uVar12 = (uint)*pbVar13;
            }
            iVar5 = iVar20 + 8;
            uVar23 = uVar23 | uVar12 << ((byte)iVar5 & 0x1f);
            a->code_buffer = uVar23;
            a->num_bits = iVar20 + 0x10;
            pbVar13 = pbVar18;
          } while (iVar5 < 0x11);
          uVar6 = iVar20 + 0x10;
        }
        uVar22 = uVar23 >> 5;
        a->code_buffer = uVar22;
        uVar12 = uVar6 - 5;
        a->num_bits = uVar12;
        if (uVar12 < 5) {
          pbVar13 = a->zbuffer;
          iVar5 = uVar6 - 0xd;
          do {
            iVar20 = iVar5;
            uVar12 = 0;
            pbVar18 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar18 = pbVar13 + 1;
              a->zbuffer = pbVar18;
              uVar12 = (uint)*pbVar13;
            }
            iVar5 = iVar20 + 8;
            uVar22 = uVar22 | uVar12 << ((byte)iVar5 & 0x1f);
            a->code_buffer = uVar22;
            a->num_bits = iVar20 + 0x10;
            pbVar13 = pbVar18;
          } while (iVar5 < 0x11);
          uVar12 = iVar20 + 0x10;
        }
        uVar7 = uVar22 >> 5;
        a->code_buffer = uVar7;
        uVar6 = uVar12 - 5;
        a->num_bits = uVar6;
        if (uVar6 < 4) {
          pbVar13 = a->zbuffer;
          iVar5 = uVar12 - 0xd;
          do {
            iVar20 = iVar5;
            uVar12 = 0;
            pbVar18 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar18 = pbVar13 + 1;
              a->zbuffer = pbVar18;
              uVar12 = (uint)*pbVar13;
            }
            iVar5 = iVar20 + 8;
            uVar7 = uVar7 | uVar12 << ((byte)iVar5 & 0x1f);
            a->code_buffer = uVar7;
            a->num_bits = iVar20 + 0x10;
            pbVar13 = pbVar18;
          } while (iVar5 < 0x11);
          uVar6 = iVar20 + 0x10;
        }
        uVar23 = (uVar23 & 0x1f) + 0x101;
        iVar20 = (uVar22 & 0x1f) + 1;
        uVar12 = uVar7 >> 4;
        a->code_buffer = uVar12;
        iVar5 = uVar6 - 4;
        a->num_bits = iVar5;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        uVar17 = 0;
        do {
          uVar22 = uVar12;
          if (iVar5 < 3) {
            pbVar13 = a->zbuffer;
            iVar21 = iVar5;
            do {
              uVar12 = 0;
              pbVar18 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar18 = pbVar13 + 1;
                a->zbuffer = pbVar18;
                uVar12 = (uint)*pbVar13;
              }
              uVar22 = uVar22 | uVar12 << ((byte)iVar21 & 0x1f);
              a->code_buffer = uVar22;
              iVar5 = iVar21 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar21 < 0x11;
              pbVar13 = pbVar18;
              iVar21 = iVar5;
            } while (bVar3);
          }
          uVar12 = uVar22 >> 3;
          a->code_buffer = uVar12;
          iVar5 = iVar5 + -3;
          a->num_bits = iVar5;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar17]] =
               (byte)uVar22 & 7;
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uVar7 & 0xf) + 4);
        iVar5 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar5 == 0) {
          return 0;
        }
        iVar21 = iVar20 + uVar23;
        iVar5 = a->num_bits;
        iVar24 = 0;
        do {
          if (iVar5 < 0x10) {
            uVar12 = a->code_buffer;
            pbVar13 = a->zbuffer;
            iVar25 = iVar5;
            do {
              uVar22 = 0;
              pbVar18 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar18 = pbVar13 + 1;
                a->zbuffer = pbVar18;
                uVar22 = (uint)*pbVar13;
              }
              uVar12 = uVar12 | uVar22 << ((byte)iVar25 & 0x1f);
              a->code_buffer = uVar12;
              iVar5 = iVar25 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar25 < 0x11;
              pbVar13 = pbVar18;
              iVar25 = iVar5;
            } while (bVar3);
          }
          else {
            uVar12 = a->code_buffer;
          }
          uVar11 = local_814.fast[uVar12 & 0x1ff];
          if (uVar11 == 0) {
            uVar11 = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
            uVar22 = (uVar11 & 0xf0f) << 4 | (uVar11 & 0xf0f0) >> 4;
            uVar22 = (uVar22 >> 2 & 0x3333) + (uVar22 & 0x3333) * 4;
            uVar22 = (uVar22 >> 1 & 0x5555) + (uVar22 & 0x5555) * 2;
            lVar9 = 0;
            do {
              lVar10 = lVar9;
              lVar9 = lVar10 + 1;
            } while (local_814.maxcode[lVar10 + 10] <= (int)uVar22);
            if (lVar9 == 7) goto LAB_0014215c;
            uVar11 = local_814.firstcode[lVar10 + 10];
            uVar1 = local_814.firstsymbol[lVar10 + 10];
            uVar12 = uVar12 >> ((char)lVar10 + 10U & 0x1f);
            a->code_buffer = uVar12;
            iVar5 = (iVar5 - (int)lVar9) + -9;
            a->num_bits = iVar5;
            uVar11 = *(ushort *)
                      ((long)&local_814 +
                      ((ulong)uVar1 + ((ulong)(uVar22 >> (7U - (char)lVar9 & 0x1f)) - (ulong)uVar11)
                      ) * 2 + 0x5a4);
          }
          else {
            uVar12 = uVar12 >> ((byte)(uVar11 >> 9) & 0x1f);
            a->code_buffer = uVar12;
            iVar5 = iVar5 - (uint)(uVar11 >> 9);
            a->num_bits = iVar5;
            uVar11 = uVar11 & 0x1ff;
          }
          if (0x12 < uVar11) goto LAB_0014215c;
          if (uVar11 < 0x10) {
            lVar9 = (long)iVar24;
            iVar24 = iVar24 + 1;
            local_9e8[lVar9] = (char)uVar11;
          }
          else {
            if (uVar11 == 0x11) {
              if (iVar5 < 3) {
                pbVar13 = a->zbuffer;
                iVar25 = iVar5;
                do {
                  uVar22 = 0;
                  pbVar18 = pbVar13;
                  if (pbVar13 < a->zbuffer_end) {
                    pbVar18 = pbVar13 + 1;
                    a->zbuffer = pbVar18;
                    uVar22 = (uint)*pbVar13;
                  }
                  uVar12 = uVar12 | uVar22 << ((byte)iVar25 & 0x1f);
                  a->code_buffer = uVar12;
                  iVar5 = iVar25 + 8;
                  a->num_bits = iVar5;
                  bVar3 = iVar25 < 0x11;
                  pbVar13 = pbVar18;
                  iVar25 = iVar5;
                } while (bVar3);
              }
              a->code_buffer = uVar12 >> 3;
              iVar5 = iVar5 + -3;
              a->num_bits = iVar5;
              uVar12 = (uVar12 & 7) + 3;
LAB_00141c48:
              uVar22 = 0;
            }
            else {
              if (uVar11 != 0x10) {
                if (iVar5 < 7) {
                  pbVar13 = a->zbuffer;
                  iVar25 = iVar5;
                  do {
                    uVar22 = 0;
                    pbVar18 = pbVar13;
                    if (pbVar13 < a->zbuffer_end) {
                      pbVar18 = pbVar13 + 1;
                      a->zbuffer = pbVar18;
                      uVar22 = (uint)*pbVar13;
                    }
                    uVar12 = uVar12 | uVar22 << ((byte)iVar25 & 0x1f);
                    a->code_buffer = uVar12;
                    iVar5 = iVar25 + 8;
                    a->num_bits = iVar5;
                    bVar3 = iVar25 < 0x11;
                    pbVar13 = pbVar18;
                    iVar25 = iVar5;
                  } while (bVar3);
                }
                a->code_buffer = uVar12 >> 7;
                iVar5 = iVar5 + -7;
                a->num_bits = iVar5;
                uVar12 = (uVar12 & 0x7f) + 0xb;
                goto LAB_00141c48;
              }
              if (iVar5 < 2) {
                pbVar13 = a->zbuffer;
                iVar25 = iVar5;
                do {
                  uVar22 = 0;
                  pbVar18 = pbVar13;
                  if (pbVar13 < a->zbuffer_end) {
                    pbVar18 = pbVar13 + 1;
                    a->zbuffer = pbVar18;
                    uVar22 = (uint)*pbVar13;
                  }
                  uVar12 = uVar12 | uVar22 << ((byte)iVar25 & 0x1f);
                  a->code_buffer = uVar12;
                  iVar5 = iVar25 + 8;
                  a->num_bits = iVar5;
                  bVar3 = iVar25 < 0x11;
                  pbVar13 = pbVar18;
                  iVar25 = iVar5;
                } while (bVar3);
              }
              a->code_buffer = uVar12 >> 2;
              iVar5 = iVar5 + -2;
              a->num_bits = iVar5;
              if (iVar24 == 0) goto LAB_0014215c;
              uVar12 = (uVar12 & 3) + 3;
              uVar22 = (uint)(&bStack_9e9)[iVar24];
            }
            if (iVar21 - iVar24 < (int)uVar12) goto LAB_0014215c;
            memset(local_9e8 + iVar24,uVar22,(ulong)uVar12);
            iVar24 = iVar24 + uVar12;
          }
        } while (iVar24 < iVar21);
        if (iVar24 != iVar21) {
LAB_0014215c:
          pcVar8 = "bad codelengths";
          goto LAB_00142187;
        }
        iVar5 = stbi__zbuild_huffman(z,local_9e8,uVar23);
        if (iVar5 == 0) {
          return 0;
        }
        psVar16 = local_9e8 + uVar23;
        break;
      case 3:
        goto LAB_00142192;
      }
      iVar5 = stbi__zbuild_huffman(&a->z_distance,psVar16,iVar20);
      if (iVar5 == 0) {
        return 0;
      }
      obuf = a->zout;
LAB_00141cd4:
      iVar5 = a->num_bits;
      if (iVar5 < 0x10) {
        uVar12 = a->code_buffer;
        pbVar13 = a->zbuffer;
        iVar20 = iVar5;
        do {
          uVar22 = 0;
          pbVar18 = pbVar13;
          if (pbVar13 < a->zbuffer_end) {
            pbVar18 = pbVar13 + 1;
            a->zbuffer = pbVar18;
            uVar22 = (uint)*pbVar13;
          }
          uVar12 = uVar12 | uVar22 << ((byte)iVar20 & 0x1f);
          a->code_buffer = uVar12;
          iVar5 = iVar20 + 8;
          a->num_bits = iVar5;
          bVar3 = iVar20 < 0x11;
          pbVar13 = pbVar18;
          iVar20 = iVar5;
        } while (bVar3);
      }
      else {
        uVar12 = a->code_buffer;
      }
      uVar11 = z->fast[uVar12 & 0x1ff];
      if (uVar11 == 0) {
        uVar11 = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
        uVar22 = (uVar11 & 0xf0f) << 4 | (uVar11 & 0xf0f0) >> 4;
        uVar22 = (uVar22 >> 2 & 0x3333) + (uVar22 & 0x3333) * 4;
        uVar22 = (uVar22 >> 1 & 0x5555) + (uVar22 & 0x5555) * 2;
        lVar9 = 0;
        do {
          lVar10 = lVar9;
          lVar9 = lVar10 + 1;
        } while ((a->z_length).maxcode[lVar10 + 10] <= (int)uVar22);
        if (lVar9 != 7) {
          uVar11 = (a->z_length).firstcode[lVar10 + 10];
          uVar1 = (a->z_length).firstsymbol[lVar10 + 10];
          uVar12 = uVar12 >> ((char)lVar10 + 10U & 0x1f);
          a->code_buffer = uVar12;
          iVar5 = (iVar5 - (int)lVar9) + -9;
          a->num_bits = iVar5;
          uVar22 = (uint)*(ushort *)
                          ((long)a +
                          ((ulong)uVar1 +
                          ((ulong)(uVar22 >> (7U - (char)lVar9 & 0x1f)) - (ulong)uVar11)) * 2 +
                          0x5d8);
          goto LAB_00141dce;
        }
LAB_0014216e:
        pcVar8 = "bad huffman code";
        goto LAB_00142187;
      }
      uVar12 = uVar12 >> ((byte)(uVar11 >> 9) & 0x1f);
      a->code_buffer = uVar12;
      iVar5 = iVar5 - (uint)(uVar11 >> 9);
      a->num_bits = iVar5;
      uVar22 = uVar11 & 0x1ff;
LAB_00141dce:
      if (uVar22 < 0x100) {
        if (a->zout_end <= obuf) {
          iVar5 = stbi__zexpand(a,obuf,1);
          if (iVar5 == 0) {
            return 0;
          }
          obuf = a->zout;
        }
        *obuf = (char)uVar22;
        obuf = obuf + 1;
        goto LAB_00141cd4;
      }
      if (uVar22 != 0x100) {
        uVar17 = (ulong)(uVar22 - 0x101);
        uVar22 = stbi__zlength_base[uVar17];
        if (0xffffffffffffffeb < uVar17 - 0x1c) {
          iVar20 = stbi__zlength_extra[uVar17];
          if (iVar5 < iVar20) {
            pbVar13 = a->zbuffer;
            iVar21 = iVar5;
            do {
              uVar6 = 0;
              pbVar18 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar18 = pbVar13 + 1;
                a->zbuffer = pbVar18;
                uVar6 = (uint)*pbVar13;
              }
              uVar12 = uVar12 | uVar6 << ((byte)iVar21 & 0x1f);
              a->code_buffer = uVar12;
              iVar5 = iVar21 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar21 < 0x11;
              pbVar13 = pbVar18;
              iVar21 = iVar5;
            } while (bVar3);
          }
          uVar6 = ~(-1 << ((byte)iVar20 & 0x1f)) & uVar12;
          uVar12 = uVar12 >> ((byte)iVar20 & 0x1f);
          a->code_buffer = uVar12;
          iVar5 = iVar5 - iVar20;
          a->num_bits = iVar5;
          uVar22 = uVar22 + uVar6;
        }
        if (iVar5 < 0x10) {
          pbVar13 = a->zbuffer;
          iVar20 = iVar5;
          do {
            uVar6 = 0;
            pbVar18 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar18 = pbVar13 + 1;
              a->zbuffer = pbVar18;
              uVar6 = (uint)*pbVar13;
            }
            uVar12 = uVar12 | uVar6 << ((byte)iVar20 & 0x1f);
            a->code_buffer = uVar12;
            iVar5 = iVar20 + 8;
            a->num_bits = iVar5;
            bVar3 = iVar20 < 0x11;
            pbVar13 = pbVar18;
            iVar20 = iVar5;
          } while (bVar3);
        }
        uVar11 = (a->z_distance).fast[uVar12 & 0x1ff];
        if (uVar11 == 0) {
          uVar11 = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
          uVar6 = (uVar11 & 0xf0f) << 4 | (uVar11 & 0xf0f0) >> 4;
          uVar6 = (uVar6 >> 2 & 0x3333) + (uVar6 & 0x3333) * 4;
          uVar6 = (uVar6 >> 1 & 0x5555) + (uVar6 & 0x5555) * 2;
          lVar9 = 0;
          do {
            lVar10 = lVar9;
            lVar9 = lVar10 + 1;
          } while ((a->z_distance).maxcode[lVar10 + 10] <= (int)uVar6);
          if (lVar9 == 7) goto LAB_0014216e;
          uVar11 = (a->z_distance).firstcode[lVar10 + 10];
          uVar1 = (a->z_distance).firstsymbol[lVar10 + 10];
          uVar12 = uVar12 >> ((char)lVar10 + 10U & 0x1f);
          a->code_buffer = uVar12;
          iVar5 = (iVar5 - (int)lVar9) + -9;
          a->num_bits = iVar5;
          uVar6 = (uint)*(ushort *)
                         ((long)a +
                         ((ulong)uVar1 +
                         ((ulong)(uVar6 >> (7U - (char)lVar9 & 0x1f)) - (ulong)uVar11)) * 2 + 0xdbc)
          ;
        }
        else {
          uVar12 = uVar12 >> ((byte)(uVar11 >> 9) & 0x1f);
          a->code_buffer = uVar12;
          iVar5 = iVar5 - (uint)(uVar11 >> 9);
          a->num_bits = iVar5;
          uVar6 = uVar11 & 0x1ff;
        }
        uVar17 = (ulong)uVar6;
        iVar20 = stbi__zdist_base[uVar17];
        if (0xffffffffffffffe5 < uVar17 - 0x1e) {
          iVar21 = stbi__zdist_extra[uVar17];
          if (iVar5 < iVar21) {
            pbVar13 = a->zbuffer;
            iVar24 = iVar5;
            do {
              uVar6 = 0;
              pbVar18 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar18 = pbVar13 + 1;
                a->zbuffer = pbVar18;
                uVar6 = (uint)*pbVar13;
              }
              uVar12 = uVar12 | uVar6 << ((byte)iVar24 & 0x1f);
              a->code_buffer = uVar12;
              iVar5 = iVar24 + 8;
              a->num_bits = iVar5;
              bVar3 = iVar24 < 0x11;
              pbVar13 = pbVar18;
              iVar24 = iVar5;
            } while (bVar3);
          }
          a->code_buffer = uVar12 >> ((byte)iVar21 & 0x1f);
          a->num_bits = iVar5 - iVar21;
          iVar20 = iVar20 + (~(-1 << ((byte)iVar21 & 0x1f)) & uVar12);
        }
        if ((long)obuf - (long)a->zout_start < (long)iVar20) {
          pcVar8 = "bad dist";
          goto LAB_00142187;
        }
        if (a->zout_end < obuf + (int)uVar22) {
          iVar5 = stbi__zexpand(a,obuf,uVar22);
          if (iVar5 == 0) {
            return 0;
          }
          obuf = a->zout;
        }
        lVar9 = -(long)iVar20;
        if (iVar20 == 1) {
          if (uVar22 != 0) {
            memset(obuf,(uint)(byte)obuf[lVar9],(ulong)uVar22);
            obuf = obuf + (ulong)(uVar22 - 1) + 1;
          }
        }
        else {
          for (; uVar22 != 0; uVar22 = uVar22 - 1) {
            *obuf = obuf[lVar9];
            obuf = obuf + 1;
          }
        }
        goto LAB_00141cd4;
      }
      a->zout = obuf;
LAB_0014214e:
      if ((uVar14 & 1) != 0) {
        return 1;
      }
      iVar5 = a->num_bits;
    } while( true );
  }
  pbVar13 = a->zbuffer;
  uVar11 = 0;
  if (pbVar13 < a->zbuffer_end) {
    a->zbuffer = pbVar13 + 1;
    bVar4 = *pbVar13;
    pbVar13 = pbVar13 + 1;
  }
  else {
    bVar4 = 0;
  }
  if (pbVar13 < a->zbuffer_end) {
    a->zbuffer = pbVar13 + 1;
    uVar11 = (ushort)*pbVar13;
  }
  if ((ushort)(((ushort)bVar4 << 8 | uVar11) * 0x7bdf) < 0x843) {
    if ((uVar11 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_001416ad;
      pcVar8 = "bad compression";
    }
    else {
      pcVar8 = "no preset dict";
    }
  }
  else {
    pcVar8 = "bad zlib header";
  }
LAB_00142187:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
LAB_00142192:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}